

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall Node::OutputOpenStuff(Node *this,ostream *os,Node *Channel)

{
  int iVar1;
  ostream *poVar2;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  iVar1 = this->Type;
  switch(iVar1) {
  case 0x102:
    Indent_abi_cxx11_(&local_80,this);
    poVar2 = std::operator<<(os,(string *)&local_80);
    GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_a0);
    poVar2 = std::operator<<(poVar2,".SetAccess(");
    poVar2 = std::operator<<(poVar2,(string *)&this->Tree[0]->TextValue);
    poVar2 = std::operator<<(poVar2,");");
    std::endl<char,std::char_traits<char>>(poVar2);
    goto LAB_0011440f;
  case 0x103:
  case 0x106:
  case 0x107:
  case 0x108:
  case 0x109:
  case 0x10a:
  case 0x10b:
switchD_001139af_caseD_172:
    Indent_abi_cxx11_(&local_80,this);
    poVar2 = std::operator<<(os,(string *)&local_80);
    GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_a0);
    poVar2 = std::operator<<(poVar2,".GoofyOpenStuff(");
    Expression_abi_cxx11_(&local_60,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_60);
    poVar2 = std::operator<<(poVar2,");");
    std::endl<char,std::char_traits<char>>(poVar2);
    break;
  case 0x104:
    Indent_abi_cxx11_(&local_80,this);
    poVar2 = std::operator<<(os,(string *)&local_80);
    GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_a0);
    poVar2 = std::operator<<(poVar2,".SetAllow(");
    poVar2 = std::operator<<(poVar2,(string *)&this->Tree[0]->TextValue);
    poVar2 = std::operator<<(poVar2,");");
    std::endl<char,std::char_traits<char>>(poVar2);
    goto LAB_0011440f;
  case 0x105:
    Indent_abi_cxx11_(&local_80,this);
    poVar2 = std::operator<<(os,(string *)&local_80);
    GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_a0);
    poVar2 = std::operator<<(poVar2,".SetKey(");
    Expression_abi_cxx11_(&local_60,this->Tree[0]);
    poVar2 = std::operator<<(poVar2,(string *)&local_60);
    poVar2 = std::operator<<(poVar2,");");
    std::endl<char,std::char_traits<char>>(poVar2);
    break;
  case 0x10c:
    Indent_abi_cxx11_(&local_80,this);
    poVar2 = std::operator<<(os,(string *)&local_80);
    GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_a0);
    poVar2 = std::operator<<(poVar2,".SetBlockSize(");
    Expression_abi_cxx11_(&local_60,this->Tree[0]);
    poVar2 = std::operator<<(poVar2,(string *)&local_60);
    poVar2 = std::operator<<(poVar2,");");
    std::endl<char,std::char_traits<char>>(poVar2);
    break;
  case 0x10d:
    Indent_abi_cxx11_(&local_80,this);
    poVar2 = std::operator<<(os,(string *)&local_80);
    GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_a0);
    poVar2 = std::operator<<(poVar2,".SetBucketSize(");
    Expression_abi_cxx11_(&local_60,this->Tree[0]);
    poVar2 = std::operator<<(poVar2,(string *)&local_60);
    poVar2 = std::operator<<(poVar2,");");
    std::endl<char,std::char_traits<char>>(poVar2);
    break;
  case 0x10e:
    Indent_abi_cxx11_(&local_80,this);
    poVar2 = std::operator<<(os,(string *)&local_80);
    GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_a0);
    poVar2 = std::operator<<(poVar2,".SetBuffer(");
    Expression_abi_cxx11_(&local_60,this->Tree[0]);
    poVar2 = std::operator<<(poVar2,(string *)&local_60);
    poVar2 = std::operator<<(poVar2,");");
    std::endl<char,std::char_traits<char>>(poVar2);
    break;
  default:
    switch(iVar1) {
    case 0x170:
      Indent_abi_cxx11_(&local_80,this);
      poVar2 = std::operator<<(os,(string *)&local_80);
      GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
      poVar2 = std::operator<<(poVar2,(string *)&local_a0);
      poVar2 = std::operator<<(poVar2,".SetRewind(False);");
      std::endl<char,std::char_traits<char>>(poVar2);
      break;
    case 0x171:
      Indent_abi_cxx11_(&local_80,this);
      poVar2 = std::operator<<(os,(string *)&local_80);
      GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
      poVar2 = std::operator<<(poVar2,(string *)&local_a0);
      poVar2 = std::operator<<(poVar2,".SetSpan(False);");
      std::endl<char,std::char_traits<char>>(poVar2);
      break;
    case 0x172:
    case 0x173:
    case 0x174:
    case 0x176:
    case 0x177:
    case 0x178:
      goto switchD_001139af_caseD_172;
    case 0x175:
      Indent_abi_cxx11_(&local_80,this);
      poVar2 = std::operator<<(os,(string *)&local_80);
      GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
      poVar2 = std::operator<<(poVar2,(string *)&local_a0);
      poVar2 = std::operator<<(poVar2,".SetOrginization(");
      std::operator<<(poVar2,(string *)&this->Tree[0]->TextValue);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      if (this->Tree[0]->Tree[0] != (Node *)0x0) {
        poVar2 = std::operator<<(os,", ");
        std::operator<<(poVar2,(string *)&this->Tree[0]->Tree[0]->TextValue);
      }
      poVar2 = std::operator<<(os,");");
      std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_00114423;
    case 0x179:
      Indent_abi_cxx11_(&local_80,this);
      poVar2 = std::operator<<(os,(string *)&local_80);
      GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
      poVar2 = std::operator<<(poVar2,(string *)&local_a0);
      poVar2 = std::operator<<(poVar2,".SetKey(");
      Expression_abi_cxx11_(&local_60,this->Tree[0]);
      poVar2 = std::operator<<(poVar2,(string *)&local_60);
      poVar2 = std::operator<<(poVar2,");");
      std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_00114405;
    default:
      if (iVar1 == 0x11a) {
        Indent_abi_cxx11_(&local_80,this);
        poVar2 = std::operator<<(os,(string *)&local_80);
        GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
        poVar2 = std::operator<<(poVar2,(string *)&local_a0);
        poVar2 = std::operator<<(poVar2,".SetClusterSize(");
        Expression_abi_cxx11_(&local_60,this->Tree[0]);
        poVar2 = std::operator<<(poVar2,(string *)&local_60);
        poVar2 = std::operator<<(poVar2,");");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      else {
        if (iVar1 == 0x11e) {
          Indent_abi_cxx11_(&local_80,this);
          poVar2 = std::operator<<(os,(string *)&local_80);
          GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
          poVar2 = std::operator<<(poVar2,(string *)&local_a0);
          poVar2 = std::operator<<(poVar2,".SetContiguous(True);");
          std::endl<char,std::char_traits<char>>(poVar2);
          break;
        }
        if (iVar1 == 0x120) {
          Indent_abi_cxx11_(&local_80,this);
          poVar2 = std::operator<<(os,(string *)&local_80);
          GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
          poVar2 = std::operator<<(poVar2,(string *)&local_a0);
          poVar2 = std::operator<<(poVar2,".SetConnect(BasicChannel[");
          Expression_abi_cxx11_(&local_60,this->Tree[0]);
          poVar2 = std::operator<<(poVar2,(string *)&local_60);
          poVar2 = std::operator<<(poVar2,"]);");
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        else if (iVar1 == 0x127) {
          Indent_abi_cxx11_(&local_80,this);
          poVar2 = std::operator<<(os,(string *)&local_80);
          GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
          poVar2 = std::operator<<(poVar2,(string *)&local_a0);
          poVar2 = std::operator<<(poVar2,".SetDefaultName(");
          Expression_abi_cxx11_(&local_60,this->Tree[0]);
          poVar2 = std::operator<<(poVar2,(string *)&local_60);
          poVar2 = std::operator<<(poVar2,");");
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        else if (iVar1 == 0x136) {
          Indent_abi_cxx11_(&local_80,this);
          poVar2 = std::operator<<(os,(string *)&local_80);
          GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
          poVar2 = std::operator<<(poVar2,(string *)&local_a0);
          poVar2 = std::operator<<(poVar2,".SetExtendSize(");
          Expression_abi_cxx11_(&local_60,this->Tree[0]);
          poVar2 = std::operator<<(poVar2,(string *)&local_60);
          poVar2 = std::operator<<(poVar2,");");
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        else if (iVar1 == 0x13a) {
          Indent_abi_cxx11_(&local_80,this);
          poVar2 = std::operator<<(os,(string *)&local_80);
          GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
          poVar2 = std::operator<<(poVar2,(string *)&local_a0);
          poVar2 = std::operator<<(poVar2,".SetFileSize(");
          Expression_abi_cxx11_(&local_60,this->Tree[0]);
          poVar2 = std::operator<<(poVar2,(string *)&local_60);
          poVar2 = std::operator<<(poVar2,");");
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        else if (iVar1 == 0x161) {
          Indent_abi_cxx11_(&local_80,this);
          poVar2 = std::operator<<(os,(string *)&local_80);
          GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
          poVar2 = std::operator<<(poVar2,(string *)&local_a0);
          poVar2 = std::operator<<(poVar2,".SetMap(");
          Expression_abi_cxx11_(&local_60,this->Tree[0]);
          poVar2 = std::operator<<(poVar2,(string *)&local_60);
          poVar2 = std::operator<<(poVar2,", sizeof(");
          Expression_abi_cxx11_(&local_40,this->Tree[0]);
          poVar2 = std::operator<<(poVar2,(string *)&local_40);
          poVar2 = std::operator<<(poVar2,"));");
          std::endl<char,std::char_traits<char>>(poVar2);
          std::__cxx11::string::~string((string *)&local_40);
        }
        else {
          if (iVar1 != 0x166) {
            if (iVar1 == 0x184) {
              Indent_abi_cxx11_(&local_80,this);
              poVar2 = std::operator<<(os,(string *)&local_80);
              GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
              poVar2 = std::operator<<(poVar2,(string *)&local_a0);
              poVar2 = std::operator<<(poVar2,".SetRecordType(");
              poVar2 = std::operator<<(poVar2,(string *)&this->Tree[0]->TextValue);
              poVar2 = std::operator<<(poVar2,");");
              std::endl<char,std::char_traits<char>>(poVar2);
            }
            else {
              if (iVar1 == 0x1b9) {
                Indent_abi_cxx11_(&local_80,this);
                poVar2 = std::operator<<(os,(string *)&local_80);
                GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
                poVar2 = std::operator<<(poVar2,(string *)&local_a0);
                poVar2 = std::operator<<(poVar2,".SetWindowSize(");
                Expression_abi_cxx11_(&local_60,this->Tree[0]);
                poVar2 = std::operator<<(poVar2,(string *)&local_60);
                poVar2 = std::operator<<(poVar2,");");
                std::endl<char,std::char_traits<char>>(poVar2);
                goto LAB_00114405;
              }
              if (iVar1 == 0x19c) {
                Indent_abi_cxx11_(&local_80,this);
                poVar2 = std::operator<<(os,(string *)&local_80);
                GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
                poVar2 = std::operator<<(poVar2,(string *)&local_a0);
                poVar2 = std::operator<<(poVar2,".SetSpan(True);");
                std::endl<char,std::char_traits<char>>(poVar2);
              }
              else {
                if (iVar1 != 0x1a5) {
                  if (iVar1 == 0x1b5) goto LAB_00114423;
                  if (iVar1 != 0x185) goto switchD_001139af_caseD_172;
                  Indent_abi_cxx11_(&local_80,this);
                  poVar2 = std::operator<<(os,(string *)&local_80);
                  GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
                  poVar2 = std::operator<<(poVar2,(string *)&local_a0);
                  poVar2 = std::operator<<(poVar2,".SetRecordSize(");
                  Expression_abi_cxx11_(&local_60,this->Tree[0]);
                  poVar2 = std::operator<<(poVar2,(string *)&local_60);
                  poVar2 = std::operator<<(poVar2,");");
                  std::endl<char,std::char_traits<char>>(poVar2);
                  goto LAB_00114405;
                }
                Indent_abi_cxx11_(&local_80,this);
                poVar2 = std::operator<<(os,(string *)&local_80);
                GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
                poVar2 = std::operator<<(poVar2,(string *)&local_a0);
                poVar2 = std::operator<<(poVar2,".SetTemporary(True);");
                std::endl<char,std::char_traits<char>>(poVar2);
              }
            }
            break;
          }
          Indent_abi_cxx11_(&local_80,this);
          poVar2 = std::operator<<(os,(string *)&local_80);
          GetIPChannel_abi_cxx11_(&local_a0,Channel,0);
          poVar2 = std::operator<<(poVar2,(string *)&local_a0);
          poVar2 = std::operator<<(poVar2,".SetMode(");
          Expression_abi_cxx11_(&local_60,this->Tree[0]);
          poVar2 = std::operator<<(poVar2,(string *)&local_60);
          poVar2 = std::operator<<(poVar2,");");
          std::endl<char,std::char_traits<char>>(poVar2);
        }
      }
      goto LAB_00114405;
    }
    goto LAB_0011440f;
  }
LAB_00114405:
  std::__cxx11::string::~string((string *)&local_60);
LAB_0011440f:
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
LAB_00114423:
  if (this->Block[0] != (Node *)0x0) {
    OutputOpenStuff(this->Block[0],os,Channel);
  }
  return;
}

Assistant:

void Node::OutputOpenStuff(
	std::ostream& os,	/**< iosream to write C++ code to */
	Node* Channel		/**< Basic IO channel */
)
{
	switch(Type)
	{
	case BAS_S_RECORDSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRecordSize(" << Tree[0]->Expression() << ");" << std::endl;
		break;

	case BAS_S_CLUSTERSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetClusterSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_FILESIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetFileSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_EXTENDSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetExtendSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_WINDOWSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetWindowSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_BLOCKSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetBlockSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_BUCKETSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetBucketSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_MODE:

		os << Indent() <<
			GetIPChannel(Channel, 0)<<
			".SetMode(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_BUFFER:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetBuffer(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_DEFAULTNAME:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetDefaultName(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_PRIMARY:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetKey(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_ALTERNATE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetKey(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_TEMPORARY:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetTemporary(True);" << std::endl;
		break;

	case BAS_S_CONTIGUOUS:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetContiguous(True);" << std::endl;
		break;

	case BAS_S_NOREWIND:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRewind(False);" << std::endl;
		break;

	case BAS_S_NOSPAN:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetSpan(False);" << std::endl;
		break;

	case BAS_S_SPAN:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetSpan(True);" << std::endl;
		break;

	case BAS_S_ORGANIZATION:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetOrginization(" << Tree[0]->TextValue;
		if (Tree[0]->Tree[0] != 0)
		{
			os << ", " << Tree[0]->Tree[0]->TextValue;
		}
		os << ");" << std::endl;
		break;

	case BAS_S_ACCESS:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetAccess(" << Tree[0]->TextValue << ");" <<
			std::endl;
		break;

	case BAS_S_ALLOW:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetAllow(" << Tree[0]->TextValue << ");" <<
			std::endl;
		break;

	case BAS_S_CONNECT:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetConnect(BasicChannel[" << Tree[0]->Expression() << "]);" <<
			std::endl;
		break;

	case BAS_S_MAP:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetMap(" << Tree[0]->Expression() << ", sizeof(" <<
			Tree[0]->Expression() <<
			"));" << std::endl;
		break;

	case BAS_S_RECORDTYPE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRecordType(" << Tree[0]->TextValue <<
			");" << std::endl;
		break;

	case BAS_S_VIRTUAL:
		break;

	default:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".GoofyOpenStuff(" << Expression() << ");" <<
			std::endl;
		break;

	}

	//
	// Handle downlink
	//
	if (Block[0] != 0)
	{
		Block[0]->OutputOpenStuff(os, Channel);
	}
}